

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void ecs_run_component_trigger
               (ecs_world_t *world,ecs_vector_t *trigger_vec,ecs_entity_t component,
               ecs_table_t *table,ecs_data_t *data,int32_t row,int32_t count)

{
  int32_t iVar1;
  void *pvVar2;
  ecs_entity_t *entities;
  int32_t row_local;
  ecs_data_t *data_local;
  ecs_table_t *table_local;
  ecs_entity_t component_local;
  ecs_vector_t *trigger_vec_local;
  ecs_world_t *world_local;
  
  _ecs_assert((_Bool)((world->in_progress ^ 0xffU) & 1),0xc,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x111);
  if ((world->in_progress & 1U) != 0) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x111,
                  "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                 );
  }
  if ((table->flags & 2) == 0) {
    pvVar2 = _ecs_vector_first(data->entities,8,0x10);
    _ecs_assert(pvVar2 != (void *)0x0,0xc,(char *)0x0,"entities != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x118);
    if (pvVar2 == (void *)0x0) {
      __assert_fail("entities != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x118,
                    "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                   );
    }
    iVar1 = ecs_vector_count(data->entities);
    _ecs_assert(row < iVar1,0xc,(char *)0x0,"row < ecs_vector_count(data->entities)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x119);
    iVar1 = ecs_vector_count(data->entities);
    if (iVar1 <= row) {
      __assert_fail("row < ecs_vector_count(data->entities)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x119,
                    "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                   );
    }
    iVar1 = ecs_vector_count(data->entities);
    _ecs_assert(row + count <= iVar1,0xc,(char *)0x0,
                "(row + count) <= ecs_vector_count(data->entities)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x11a);
    iVar1 = ecs_vector_count(data->entities);
    if (iVar1 < row + count) {
      __assert_fail("(row + count) <= ecs_vector_count(data->entities)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x11a,
                    "void ecs_run_component_trigger(ecs_world_t *, ecs_vector_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t)"
                   );
    }
    run_component_trigger_for_entities
              (world,trigger_vec,component,table,data,row,count,
               (ecs_entity_t *)((long)pvVar2 + (long)(row << 3)));
  }
  return;
}

Assistant:

static
void ecs_run_component_trigger(
    ecs_world_t * world,
    ecs_vector_t * trigger_vec,
    ecs_entity_t component,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count)
{
    ecs_assert(!world->in_progress, ECS_INTERNAL_ERROR, NULL);

    if (table->flags & EcsTableIsPrefab) {
        return;
    }

    ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);        
    ecs_assert(entities != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(row < ecs_vector_count(data->entities), ECS_INTERNAL_ERROR, NULL);
    ecs_assert((row + count) <= ecs_vector_count(data->entities), ECS_INTERNAL_ERROR, NULL);

    entities = ECS_OFFSET(entities, ECS_SIZEOF(ecs_entity_t) * row);

    run_component_trigger_for_entities(
        world, trigger_vec, component, table, data, row, count, entities);
}